

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::handleFatalErrorCondition(RunContext *this,StringRef message)

{
  size_t _testInfo;
  pointer pIVar1;
  TestCaseInfo *_name;
  TestRunStats local_488;
  string local_420;
  string local_400;
  string local_3e0;
  TestCaseStats local_3c0;
  undefined1 local_290 [8];
  Totals deltaTotals;
  TestCaseInfo *testInfo;
  SectionStats testCaseSectionStats;
  Counts assertions;
  SectionInfo testCaseSection;
  TestCaseInfo *testCaseInfo;
  AssertionResult result;
  string local_c0;
  LazyExpression local_a0;
  undefined1 local_90 [8];
  AssertionResultData tempResult;
  RunContext *this_local;
  StringRef message_local;
  
  message_local.m_start = (char *)message.m_size;
  this_local = (RunContext *)message.m_start;
  pIVar1 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->(&this->m_reporter);
  tempResult.resultType = (OfType)this_local;
  tempResult._84_4_ = this_local._4_4_;
  (*pIVar1->_vptr_IStreamingReporter[0x10])(pIVar1,this_local,message_local.m_start);
  LazyExpression::LazyExpression(&local_a0,false);
  AssertionResultData::AssertionResultData
            ((AssertionResultData *)local_90,FatalErrorCondition,&local_a0);
  StringRef::operator_cast_to_string(&local_c0,(StringRef *)&this_local);
  std::__cxx11::string::operator=((string *)local_90,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  AssertionResult::AssertionResult
            ((AssertionResult *)&testCaseInfo,&this->m_lastAssertionInfo,
             (AssertionResultData *)local_90);
  assertionEnded(this,(AssertionResult *)&testCaseInfo);
  handleUnfinishedSections(this);
  _name = TestCase::getTestCaseInfo(this->m_activeTestCase);
  SectionInfo::SectionInfo((SectionInfo *)&assertions.failedButOk,&_name->lineInfo,&_name->name);
  Counts::Counts((Counts *)&testCaseSectionStats.missingAssertions);
  assertions.passed = 1;
  SectionStats::SectionStats
            ((SectionStats *)&testInfo,(SectionInfo *)&assertions.failedButOk,
             (Counts *)&testCaseSectionStats.missingAssertions,0.0,false);
  pIVar1 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->(&this->m_reporter);
  (*pIVar1->_vptr_IStreamingReporter[0xb])(pIVar1,&testInfo);
  deltaTotals.testCases.failedButOk = (size_t)TestCase::getTestCaseInfo(this->m_activeTestCase);
  Totals::Totals((Totals *)local_290);
  deltaTotals.testCases.passed = 1;
  deltaTotals.assertions.passed = 1;
  pIVar1 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->(&this->m_reporter);
  _testInfo = deltaTotals.testCases.failedButOk;
  std::__cxx11::string::string((string *)&local_3e0);
  std::__cxx11::string::string((string *)&local_400);
  TestCaseStats::TestCaseStats
            (&local_3c0,(TestCaseInfo *)_testInfo,(Totals *)local_290,&local_3e0,&local_400,false);
  (*pIVar1->_vptr_IStreamingReporter[0xc])(pIVar1,&local_3c0);
  TestCaseStats::~TestCaseStats(&local_3c0);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&local_3e0);
  (this->m_totals).testCases.failed = (this->m_totals).testCases.failed + 1;
  std::__cxx11::string::string((string *)&local_420);
  testGroupEnded(this,&local_420,&this->m_totals,1,1);
  std::__cxx11::string::~string((string *)&local_420);
  pIVar1 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->(&this->m_reporter);
  TestRunStats::TestRunStats(&local_488,&this->m_runInfo,&this->m_totals,false);
  (*pIVar1->_vptr_IStreamingReporter[0xe])(pIVar1,&local_488);
  TestRunStats::~TestRunStats(&local_488);
  SectionStats::~SectionStats((SectionStats *)&testInfo);
  SectionInfo::~SectionInfo((SectionInfo *)&assertions.failedButOk);
  AssertionResult::~AssertionResult((AssertionResult *)&testCaseInfo);
  AssertionResultData::~AssertionResultData((AssertionResultData *)local_90);
  return;
}

Assistant:

void RunContext::handleFatalErrorCondition(StringRef message) {
        // First notify reporter that bad things happened
        m_reporter->fatalErrorEncountered(message);

        // Don't rebuild the result -- the stringification itself can cause more fatal errors
        // Instead, fake a result data.
        AssertionResultData tempResult(ResultWas::FatalErrorCondition, { false });
        tempResult.message = static_cast<std::string>(message);
        AssertionResult result(m_lastAssertionInfo, tempResult);

        assertionEnded(result);

        handleUnfinishedSections();

        // Recreate section for test case (as we will lose the one that was in scope)
        auto const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
        SectionInfo testCaseSection(testCaseInfo.lineInfo, testCaseInfo.name);

        Counts assertions;
        assertions.failed = 1;
        SectionStats testCaseSectionStats(testCaseSection, assertions, 0, false);
        m_reporter->sectionEnded(testCaseSectionStats);

        auto const& testInfo = m_activeTestCase->getTestCaseInfo();

        Totals deltaTotals;
        deltaTotals.testCases.failed = 1;
        deltaTotals.assertions.failed = 1;
        m_reporter->testCaseEnded(TestCaseStats(testInfo,
            deltaTotals,
            std::string(),
            std::string(),
            false));
        m_totals.testCases.failed++;
        testGroupEnded(std::string(), m_totals, 1, 1);
        m_reporter->testRunEnded(TestRunStats(m_runInfo, m_totals, false));
    }